

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

cl_program
xmrig::OclLib::createProgramWithSource
          (cl_context context,cl_uint count,char **strings,size_t *lengths,cl_int *errcode_ret)

{
  cl_program p_Var1;
  char *pcVar2;
  
  p_Var1 = (*pCreateProgramWithSource)(context,count,strings,lengths,errcode_ret);
  if (*errcode_ret != 0) {
    pcVar2 = OclError::toString(*errcode_ret);
    p_Var1 = (cl_program)0x0;
    Log::print(ERR,
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar2,"clCreateProgramWithSource");
  }
  return p_Var1;
}

Assistant:

cl_program xmrig::OclLib::createProgramWithSource(cl_context context, cl_uint count, const char **strings, const size_t *lengths, cl_int *errcode_ret) noexcept
{
    assert(pCreateProgramWithSource != nullptr);

    auto result = pCreateProgramWithSource(context, count, strings, lengths, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(*errcode_ret), kCreateProgramWithSource);

        return nullptr;
    }

    return result;
}